

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.hpp
# Opt level: O1

void __thiscall ear::ObjectsTypeMetadata::~ObjectsTypeMetadata(ObjectsTypeMetadata *this)

{
  boost::variant<ear::PolarScreen,_ear::CartesianScreen>::destroy_content(&this->referenceScreen);
  std::
  vector<boost::variant<ear::PolarExclusionZone,_ear::CartesianExclusionZone>,_std::allocator<boost::variant<ear::PolarExclusionZone,_ear::CartesianExclusionZone>_>_>
  ::~vector(&(this->zoneExclusion).zones);
  boost::variant<ear::PolarObjectDivergence,_ear::CartesianObjectDivergence>::destroy_content
            (&this->objectDivergence);
  boost::variant<ear::CartesianPosition,_ear::PolarPosition>::destroy_content(&this->position);
  return;
}

Assistant:

struct EAR_EXPORT ObjectsTypeMetadata {
    Position position = {};
    double width = 0.0;
    double height = 0.0;
    double depth = 0.0;
    /// value of the `cartesian` flag; should be the same type as used in
    /// position, objectDivergence and zoneExclusion, otherwise expect
    /// warnings.
    bool cartesian = false;
    double gain = 1.0;
    double diffuse = 0.0;
    ChannelLock channelLock = {};
    ObjectDivergence objectDivergence = {};
    ZoneExclusion zoneExclusion = {};
    bool screenRef = false;
    /// screen specification from the `audioProgrammeReferenceScreen` element
    /// of the `audioProgramme` being rendered
    Screen referenceScreen = getDefaultScreen();
  }